

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O3

int run_test_threadpool_cancel_getaddrinfo(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  code *pcVar8;
  long extraout_RDX;
  long extraout_RDX_00;
  undefined1 *extraout_RDX_01;
  uv_work_t *puVar9;
  uint uVar10;
  int iVar11;
  uv_work_t *puVar12;
  long lVar13;
  long lVar14;
  uv_sem_t *puVar15;
  addrinfo hints;
  cancel_info ci;
  uv_getaddrinfo_t reqs [4];
  undefined1 auStack_2310 [152];
  undefined1 auStack_2278 [2056];
  undefined1 *puStack_1a70;
  code *pcStack_1a68;
  undefined1 *puStack_1a60;
  uv_sem_t *puStack_1a58;
  code *pcStack_1a50;
  undefined1 auStack_1a40 [144];
  undefined1 auStack_19b0 [8];
  undefined1 *puStack_19a8;
  undefined1 *puStack_19a0;
  code *pcStack_1998;
  code *pcStack_1990;
  undefined1 auStack_1980 [16];
  undefined1 *puStack_1970;
  undefined8 uStack_1968;
  undefined1 auStack_1960 [152];
  undefined1 auStack_18c8 [1320];
  undefined1 auStack_13a0 [1320];
  undefined1 auStack_e78 [1320];
  undefined1 auStack_950 [1328];
  undefined1 *puStack_420;
  code *pcStack_418;
  uv_work_t *puStack_410;
  undefined1 *puStack_408;
  code *pcStack_400;
  code *pcStack_3f8;
  char acStack_3f0 [72];
  undefined8 uStack_3a8;
  undefined1 local_370 [48];
  undefined1 *local_340;
  undefined8 local_338;
  undefined1 local_330 [152];
  undefined1 local_298 [160];
  undefined1 local_1f8 [160];
  undefined1 local_158 [160];
  undefined1 local_b8 [168];
  
  local_338 = 0xa000000004;
  local_340 = local_298;
  uVar2 = uv_default_loop();
  saturate_threadpool();
  iVar1 = uv_getaddrinfo(uVar2,local_298,getaddrinfo_cb,"fail",0,0);
  if (iVar1 == 0) {
    iVar1 = uv_getaddrinfo(uVar2,local_1f8,getaddrinfo_cb,0,"fail",0);
    if (iVar1 != 0) goto LAB_00175c8a;
    iVar1 = uv_getaddrinfo(uVar2,local_158,getaddrinfo_cb,"fail","fail",0);
    if (iVar1 != 0) goto LAB_00175c8f;
    iVar1 = uv_getaddrinfo(uVar2,local_b8,getaddrinfo_cb,"fail",0,local_370);
    if (iVar1 != 0) goto LAB_00175c94;
    iVar1 = uv_timer_init(uVar2,local_330);
    if (iVar1 != 0) goto LAB_00175c99;
    iVar1 = uv_timer_start(local_330,timer_cb,10,0);
    if (iVar1 != 0) goto LAB_00175c9e;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_00175ca3;
    if (timer_cb_called == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00175cad;
    }
  }
  else {
    run_test_threadpool_cancel_getaddrinfo_cold_1();
LAB_00175c8a:
    run_test_threadpool_cancel_getaddrinfo_cold_2();
LAB_00175c8f:
    run_test_threadpool_cancel_getaddrinfo_cold_3();
LAB_00175c94:
    run_test_threadpool_cancel_getaddrinfo_cold_4();
LAB_00175c99:
    run_test_threadpool_cancel_getaddrinfo_cold_5();
LAB_00175c9e:
    run_test_threadpool_cancel_getaddrinfo_cold_6();
LAB_00175ca3:
    run_test_threadpool_cancel_getaddrinfo_cold_7();
  }
  run_test_threadpool_cancel_getaddrinfo_cold_8();
LAB_00175cad:
  run_test_threadpool_cancel_getaddrinfo_cold_9();
  lVar13 = 0;
  pcVar8 = (code *)0x4;
  pcStack_3f8 = (code *)0x175ce1;
  uStack_3a8 = uVar2;
  snprintf(acStack_3f0,0x40,"UV_THREADPOOL_SIZE=%lu");
  pcStack_3f8 = (code *)0x175ce9;
  putenv(acStack_3f0);
  puVar9 = pause_reqs;
  pcStack_3f8 = (code *)0x175cf5;
  puVar4 = (undefined1 *)uv_default_loop();
  while( true ) {
    puVar5 = (undefined1 *)((long)pause_sems + lVar13);
    iVar11 = 0;
    pcStack_3f8 = (code *)0x175d1d;
    iVar1 = uv_sem_init();
    if (iVar1 != 0) break;
    pcVar8 = done_cb;
    pcStack_3f8 = (code *)0x175d32;
    puVar12 = puVar9;
    puVar5 = puVar4;
    iVar1 = uv_queue_work(puVar4,puVar9,work_cb);
    iVar11 = (int)puVar12;
    if (iVar1 != 0) {
      pcStack_3f8 = (code *)0x175d56;
      saturate_threadpool_cold_2();
      break;
    }
    lVar13 = lVar13 + 0x20;
    puVar9 = puVar9 + 1;
    if (lVar13 == 0x80) {
      return 0;
    }
  }
  pcStack_3f8 = getaddrinfo_cb;
  saturate_threadpool_cold_1();
  if (iVar11 == -0xbbb) {
    if (extraout_RDX == 0) {
      iVar1 = uv_freeaddrinfo(0);
      return iVar1;
    }
  }
  else {
    pcStack_400 = (code *)0x175d76;
    getaddrinfo_cb_cold_1();
  }
  pcStack_400 = timer_cb;
  getaddrinfo_cb_cold_2();
  pcStack_400 = (code *)0x80;
  puStack_410 = puVar9;
  puStack_408 = puVar4;
  if (*(int *)(puVar5 + -8) == 0) {
LAB_00175da4:
    lVar13 = 0;
    pcStack_418 = (code *)0x175db1;
    uv_close(puVar5,0);
    do {
      pcStack_418 = (code *)0x175dc1;
      iVar1 = uv_sem_post((long)pause_sems + lVar13);
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x80);
    timer_cb_called = timer_cb_called + 1;
    return iVar1;
  }
  uVar10 = 0;
  while( true ) {
    pcStack_418 = (code *)0x175d99;
    iVar1 = uv_cancel((ulong)(*(int *)(puVar5 + -4) * uVar10) + *(long *)(puVar5 + -0x10));
    if (iVar1 != 0) break;
    uVar10 = uVar10 + 1;
    if (*(uint *)(puVar5 + -8) <= uVar10) goto LAB_00175da4;
  }
  pcStack_418 = run_test_threadpool_cancel_getnameinfo;
  timer_cb_cold_1();
  iVar11 = 0x50;
  pcStack_1990 = (code *)0x175dfe;
  puStack_420 = puVar5;
  pcStack_418 = (code *)puVar4;
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,auStack_1980);
  if (iVar1 == 0) {
    puVar4 = auStack_18c8;
    uStack_1968 = 0x52800000004;
    pcStack_1990 = (code *)0x175e27;
    puStack_1970 = puVar4;
    puVar5 = (undefined1 *)uv_default_loop();
    pcStack_1990 = (code *)0x175e2f;
    saturate_threadpool();
    pcVar8 = (code *)auStack_1980;
    pcStack_1990 = (code *)0x175e49;
    puVar7 = puVar4;
    iVar1 = uv_getnameinfo(puVar5,puVar4,getnameinfo_cb,pcVar8,0);
    iVar11 = (int)puVar7;
    if (iVar1 != 0) goto LAB_00175f55;
    puVar7 = auStack_13a0;
    pcVar8 = (code *)auStack_1980;
    pcStack_1990 = (code *)0x175e70;
    iVar1 = uv_getnameinfo(puVar5,puVar7,getnameinfo_cb,pcVar8,0);
    iVar11 = (int)puVar7;
    if (iVar1 != 0) goto LAB_00175f5a;
    puVar7 = auStack_e78;
    pcVar8 = (code *)auStack_1980;
    pcStack_1990 = (code *)0x175e97;
    iVar1 = uv_getnameinfo(puVar5,puVar7,getnameinfo_cb,pcVar8,0);
    iVar11 = (int)puVar7;
    if (iVar1 != 0) goto LAB_00175f5f;
    puVar7 = auStack_950;
    pcVar8 = (code *)auStack_1980;
    pcStack_1990 = (code *)0x175ebe;
    iVar1 = uv_getnameinfo(puVar5,puVar7,getnameinfo_cb,pcVar8,0);
    iVar11 = (int)puVar7;
    if (iVar1 != 0) goto LAB_00175f64;
    puVar4 = auStack_1960;
    pcStack_1990 = (code *)0x175ed6;
    puVar7 = puVar4;
    iVar1 = uv_timer_init(puVar5);
    iVar11 = (int)puVar7;
    if (iVar1 != 0) goto LAB_00175f69;
    iVar11 = 0x175d7b;
    pcVar8 = (code *)0x0;
    pcStack_1990 = (code *)0x175ef4;
    iVar1 = uv_timer_start(puVar4,timer_cb,10);
    if (iVar1 != 0) goto LAB_00175f6e;
    iVar11 = 0;
    pcStack_1990 = (code *)0x175f02;
    iVar1 = uv_run(puVar5);
    if (iVar1 != 0) goto LAB_00175f73;
    if (timer_cb_called != 1) goto LAB_00175f78;
    pcStack_1990 = (code *)0x175f14;
    puVar5 = (undefined1 *)uv_default_loop();
    pcStack_1990 = (code *)0x175f28;
    uv_walk(puVar5,close_walk_cb,0);
    iVar11 = 0;
    pcStack_1990 = (code *)0x175f32;
    uv_run(puVar5);
    pcStack_1990 = (code *)0x175f37;
    uVar2 = uv_default_loop();
    pcStack_1990 = (code *)0x175f3f;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_1990 = (code *)0x175f55;
    run_test_threadpool_cancel_getnameinfo_cold_1();
LAB_00175f55:
    pcStack_1990 = (code *)0x175f5a;
    run_test_threadpool_cancel_getnameinfo_cold_2();
LAB_00175f5a:
    pcStack_1990 = (code *)0x175f5f;
    run_test_threadpool_cancel_getnameinfo_cold_3();
LAB_00175f5f:
    pcStack_1990 = (code *)0x175f64;
    run_test_threadpool_cancel_getnameinfo_cold_4();
LAB_00175f64:
    pcStack_1990 = (code *)0x175f69;
    run_test_threadpool_cancel_getnameinfo_cold_5();
LAB_00175f69:
    pcStack_1990 = (code *)0x175f6e;
    run_test_threadpool_cancel_getnameinfo_cold_6();
LAB_00175f6e:
    pcStack_1990 = (code *)0x175f73;
    run_test_threadpool_cancel_getnameinfo_cold_7();
LAB_00175f73:
    pcStack_1990 = (code *)0x175f78;
    run_test_threadpool_cancel_getnameinfo_cold_8();
LAB_00175f78:
    pcStack_1990 = (code *)0x175f7d;
    run_test_threadpool_cancel_getnameinfo_cold_9();
  }
  pcStack_1990 = getnameinfo_cb;
  run_test_threadpool_cancel_getnameinfo_cold_10();
  if (iVar11 == -0xbbb) {
    if (extraout_RDX_00 != 0) goto LAB_00175f9c;
    if (pcVar8 == (code *)0x0) {
      return extraout_EAX;
    }
  }
  else {
    pcStack_1998 = (code *)0x175f9c;
    getnameinfo_cb_cold_1();
LAB_00175f9c:
    pcStack_1998 = (code *)0x175fa1;
    getnameinfo_cb_cold_2();
  }
  pcStack_1998 = run_test_threadpool_cancel_random;
  getnameinfo_cb_cold_3();
  pcStack_1998 = work_cb;
  pcStack_1a50 = (code *)0x175fb7;
  puStack_19a8 = puVar5;
  puStack_19a0 = puVar4;
  saturate_threadpool();
  pcStack_1a50 = (code *)0x175fbc;
  puVar6 = (undefined1 *)uv_default_loop();
  puVar5 = auStack_1a40;
  lVar13 = 1;
  pcStack_1a50 = (code *)0x175fe3;
  puVar7 = puVar6;
  iVar1 = uv_random(puVar6,puVar5,auStack_19b0,1,0,nop_random_cb);
  iVar11 = (int)puVar5;
  if (iVar1 == 0) {
    puVar7 = auStack_1a40;
    pcStack_1a50 = (code *)0x175ff5;
    iVar1 = uv_cancel();
    if (iVar1 != 0) goto LAB_00176089;
    if (done_cb_called == 0) {
      lVar14 = 0;
      puVar15 = pause_sems;
      do {
        pcStack_1a50 = (code *)0x17601d;
        uv_sem_post((long)pause_sems + lVar14);
        lVar14 = lVar14 + 0x20;
      } while (lVar14 != 0x80);
      iVar11 = 0;
      pcStack_1a50 = (code *)0x176034;
      puVar7 = puVar6;
      iVar1 = uv_run();
      puVar4 = (undefined1 *)0x80;
      if (iVar1 == 0) {
        if (done_cb_called != 1) goto LAB_00176098;
        pcStack_1a50 = (code *)0x176046;
        puVar6 = (undefined1 *)uv_default_loop();
        pcStack_1a50 = (code *)0x17605a;
        uv_walk(puVar6,close_walk_cb,0);
        iVar11 = 0;
        pcStack_1a50 = (code *)0x176064;
        uv_run(puVar6);
        pcStack_1a50 = (code *)0x176069;
        puVar7 = (undefined1 *)uv_default_loop();
        pcStack_1a50 = (code *)0x176071;
        iVar1 = uv_loop_close();
        if (iVar1 == 0) {
          return 0;
        }
      }
      else {
LAB_00176093:
        pcStack_1a50 = (code *)0x176098;
        run_test_threadpool_cancel_random_cold_4();
LAB_00176098:
        pcStack_1a50 = (code *)0x17609d;
        run_test_threadpool_cancel_random_cold_5();
      }
      pcStack_1a50 = nop_random_cb;
      run_test_threadpool_cancel_random_cold_6();
      if (iVar11 == -0x7d) {
        if (puVar7 + 0x90 != extraout_RDX_01) goto LAB_001760c7;
        if (lVar13 == 1) {
          done_cb_called = done_cb_called + 1;
          return extraout_EAX_00;
        }
      }
      else {
        puStack_1a58 = (uv_sem_t *)0x1760c7;
        nop_random_cb_cold_1();
LAB_001760c7:
        puStack_1a58 = (uv_sem_t *)0x1760cc;
        nop_random_cb_cold_2();
      }
      puStack_1a58 = (uv_sem_t *)run_test_threadpool_cancel_work;
      nop_random_cb_cold_3();
      pcStack_1a68 = done_cb;
      puStack_1a70 = puVar6;
      puStack_1a60 = puVar4;
      puStack_1a58 = puVar15;
      uVar2 = uv_default_loop();
      saturate_threadpool();
      lVar13 = 0;
      do {
        iVar1 = uv_queue_work(uVar2,auStack_2278 + lVar13,work2_cb,done2_cb);
        if (iVar1 != 0) {
          run_test_threadpool_cancel_work_cold_1();
LAB_001761e3:
          run_test_threadpool_cancel_work_cold_2();
LAB_001761e8:
          run_test_threadpool_cancel_work_cold_3();
LAB_001761ed:
          run_test_threadpool_cancel_work_cold_4();
LAB_001761f2:
          run_test_threadpool_cancel_work_cold_5();
          goto LAB_001761f7;
        }
        lVar13 = lVar13 + 0x80;
      } while (lVar13 != 0x800);
      iVar1 = uv_timer_init(uVar2,auStack_2310);
      if (iVar1 != 0) goto LAB_001761e3;
      iVar1 = uv_timer_start(auStack_2310,timer_cb,10,0);
      if (iVar1 != 0) goto LAB_001761e8;
      iVar1 = uv_run(uVar2,0);
      if (iVar1 != 0) goto LAB_001761ed;
      if (timer_cb_called != 1) goto LAB_001761f2;
      if (done2_cb_called == 0x10) {
        uVar2 = uv_default_loop();
        uv_walk(uVar2,close_walk_cb,0);
        uv_run(uVar2,0);
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_close(uVar2);
        if (iVar1 == 0) {
          return 0;
        }
        goto LAB_001761fc;
      }
LAB_001761f7:
      run_test_threadpool_cancel_work_cold_6();
LAB_001761fc:
      run_test_threadpool_cancel_work_cold_7();
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
              ,0x75,"0 && \"work2_cb called\"");
      abort();
    }
  }
  else {
    pcStack_1a50 = (code *)0x176089;
    run_test_threadpool_cancel_random_cold_1();
LAB_00176089:
    pcStack_1a50 = (code *)0x17608e;
    run_test_threadpool_cancel_random_cold_2();
  }
  pcStack_1a50 = (code *)0x176093;
  run_test_threadpool_cancel_random_cold_3();
  puVar15 = (uv_sem_t *)work_cb;
  goto LAB_00176093;
}

Assistant:

TEST_IMPL(threadpool_cancel_getaddrinfo) {
  uv_getaddrinfo_t reqs[4];
  struct cancel_info ci;
  struct addrinfo hints;
  uv_loop_t* loop;
  int r;

  INIT_CANCEL_INFO(&ci, reqs);
  loop = uv_default_loop();
  saturate_threadpool();

  r = uv_getaddrinfo(loop, reqs + 0, getaddrinfo_cb, "fail", NULL, NULL);
  ASSERT(r == 0);

  r = uv_getaddrinfo(loop, reqs + 1, getaddrinfo_cb, NULL, "fail", NULL);
  ASSERT(r == 0);

  r = uv_getaddrinfo(loop, reqs + 2, getaddrinfo_cb, "fail", "fail", NULL);
  ASSERT(r == 0);

  r = uv_getaddrinfo(loop, reqs + 3, getaddrinfo_cb, "fail", NULL, &hints);
  ASSERT(r == 0);

  ASSERT(0 == uv_timer_init(loop, &ci.timer_handle));
  ASSERT(0 == uv_timer_start(&ci.timer_handle, timer_cb, 10, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}